

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_scanner.cpp
# Opt level: O2

void __thiscall
duckdb::BaseScanner::BaseScanner
          (BaseScanner *this,shared_ptr<duckdb::CSVBufferManager,_true> *buffer_manager_p,
          shared_ptr<duckdb::CSVStateMachine,_true> *state_machine_p,
          shared_ptr<duckdb::CSVErrorHandler,_true> *error_handler_p,bool sniffing_p,
          shared_ptr<duckdb::CSVFileScan,_true> *csv_file_scan_p,CSVIterator *iterator_p)

{
  shared_ptr<duckdb::CSVBufferHandle,_true> *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  CSVBufferManager *pos;
  CSVBufferHandle *this_01;
  data_ptr_t pdVar6;
  long lVar7;
  CSVIterator *pCVar8;
  
  this->_vptr_BaseScanner = (_func_int **)&PTR__BaseScanner_027af098;
  (this->csv_file_scan).internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (csv_file_scan_p->internal).
           super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (csv_file_scan_p->internal).
           super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (csv_file_scan_p->internal).super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->csv_file_scan).internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar1;
  (this->csv_file_scan).internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var2;
  (csv_file_scan_p->internal).super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  this->sniffing = sniffing_p;
  (this->error_handler).internal.
  super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar3 = (error_handler_p->internal).
           super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (error_handler_p->internal).
           super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  (error_handler_p->internal).
  super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->error_handler).internal.
  super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  (this->error_handler).internal.
  super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var2
  ;
  (error_handler_p->internal).
  super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->state_machine).internal.
  super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar4 = (state_machine_p->internal).
           super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (state_machine_p->internal).
           super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  (state_machine_p->internal).
  super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->state_machine).internal.
  super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
  (this->state_machine).internal.
  super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var2
  ;
  (state_machine_p->internal).
  super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  this->states = (CSVState  [2])0x0;
  this->ever_quoted = false;
  this->ever_escaped = false;
  (this->buffer_manager).internal.
  super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar5 = (buffer_manager_p->internal).
           super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (buffer_manager_p->internal).
           super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (buffer_manager_p->internal).
  super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->buffer_manager).internal.
  super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
  (this->buffer_manager).internal.
  super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  (buffer_manager_p->internal).
  super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  pCVar8 = &this->iterator;
  for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
    (pCVar8->pos).buffer_idx = (iterator_p->pos).buffer_idx;
    iterator_p = (CSVIterator *)&(iterator_p->pos).buffer_pos;
    pCVar8 = (CSVIterator *)&(pCVar8->pos).buffer_pos;
  }
  *(undefined8 *)
   ((long)&(this->cur_buffer_handle).internal.
           super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
   + 1) = 0;
  *(undefined8 *)((long)&this->buffer_handle_ptr + 1) = 0;
  (this->cur_buffer_handle).internal.
  super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->cur_buffer_handle).internal.
  super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->lines_read = 0;
  this->bytes_read = 0;
  pos = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(&this->buffer_manager);
  CSVBufferManager::GetBuffer((CSVBufferManager *)&stack0xffffffffffffffc0,(idx_t)pos);
  this_00 = &this->cur_buffer_handle;
  shared_ptr<duckdb::CSVBufferHandle,_true>::operator=
            (this_00,(shared_ptr<duckdb::CSVBufferHandle,_true> *)&stack0xffffffffffffffc0);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
  if ((this_00->internal).super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    pdVar6 = (data_ptr_t)0x0;
  }
  else {
    this_01 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_00);
    pdVar6 = BufferHandle::Ptr(&this_01->handle);
  }
  this->buffer_handle_ptr = (char *)pdVar6;
  return;
}

Assistant:

BaseScanner::BaseScanner(shared_ptr<CSVBufferManager> buffer_manager_p, shared_ptr<CSVStateMachine> state_machine_p,
                         shared_ptr<CSVErrorHandler> error_handler_p, bool sniffing_p,
                         shared_ptr<CSVFileScan> csv_file_scan_p, const CSVIterator &iterator_p)
    : csv_file_scan(std::move(csv_file_scan_p)), sniffing(sniffing_p), error_handler(std::move(error_handler_p)),
      state_machine(std::move(state_machine_p)), states(), buffer_manager(std::move(buffer_manager_p)),
      iterator(iterator_p) {
	D_ASSERT(buffer_manager);
	D_ASSERT(state_machine);
	// Initialize current buffer handle
	cur_buffer_handle = buffer_manager->GetBuffer(iterator.GetBufferIdx());
	if (!cur_buffer_handle) {
		buffer_handle_ptr = nullptr;
	} else {
		buffer_handle_ptr = cur_buffer_handle->Ptr();
	}
}